

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
glcts::LayoutBindingBaseCase::makeSparseRange
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,LayoutBindingBaseCase *this,
          int maxElement,int minElement)

{
  float *pfVar1;
  vector<float,_std::allocator<float>_> rangeTemplate;
  int local_4c;
  float local_48;
  float local_44;
  float *local_40;
  float *local_38;
  long local_30;
  
  std::vector<float,std::allocator<float>>::vector<float_const*,void>
            ((vector<float,std::allocator<float>> *)&local_40,makeSparseRange::rangeT,
             (float *)&PTR_typeinfo_021cb958,(allocator_type *)&local_4c);
  local_44 = local_38[-1];
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_40 != local_38) {
    local_48 = (float)(~minElement + maxElement);
    pfVar1 = local_40;
    do {
      local_4c = (int)((*pfVar1 * local_48) / local_44) + minElement;
      std::vector<int,_std::allocator<int>_>::_M_insert_rval
                (__return_storage_ptr__,
                 (const_iterator)
                 (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,&local_4c);
      pfVar1 = pfVar1 + 1;
    } while (pfVar1 != local_38);
  }
  if (local_40 != (float *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> makeSparseRange(int maxElement, int minElement = 0) const
	{
		static float	   rangeT[]		 = { 0.0f, 0.1f, 0.5f, 0.6f, 0.9f, 1.0f };
		std::vector<float> rangeTemplate = makeVector(rangeT);
		float			   max			 = rangeTemplate.back();
		float			   range		 = (float)((maxElement - 1) - minElement);

		std::vector<int> result;
		for (std::vector<float>::iterator it = rangeTemplate.begin(); it != rangeTemplate.end(); it++)
		{
			float e = *it;
			e		= (e * range) / max;
			result.insert(result.end(), minElement + (int)e);
		}
		return result;
	}